

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

ecs_reader_t * ecs_reader_init(ecs_reader_t *__return_storage_ptr__,ecs_world_t *world)

{
  ecs_filter_t local_30;
  
  __return_storage_ptr__->world = world;
  __return_storage_ptr__->state = EcsTableSegment;
  ecs_filter_iter(&__return_storage_ptr__->data_iter,world,(ecs_filter_t *)0x0);
  __return_storage_ptr__->data_next = ecs_filter_next;
  local_30.include = FLECS__TEcsComponent;
  local_30.exclude = (ecs_type_t)0x0;
  local_30.include_kind = EcsMatchDefault;
  local_30.exclude_kind = EcsMatchDefault;
  ecs_filter_iter(&__return_storage_ptr__->component_iter,world,&local_30);
  __return_storage_ptr__->component_next = ecs_filter_next;
  (__return_storage_ptr__->table).state = EcsStreamHeader;
  (__return_storage_ptr__->table).table_index = 0;
  (__return_storage_ptr__->table).table = (ecs_table_t *)0x0;
  (__return_storage_ptr__->table).data = (ecs_data_t *)0x0;
  *(undefined8 *)&(__return_storage_ptr__->table).type_written = 0;
  (__return_storage_ptr__->table).type = (ecs_type_t)0x0;
  (__return_storage_ptr__->table).column_vector = (ecs_vector_t *)0x0;
  (__return_storage_ptr__->table).column_index = 0;
  (__return_storage_ptr__->table).total_columns = 0;
  (__return_storage_ptr__->table).column_data = (void *)0x0;
  (__return_storage_ptr__->table).column_size = 0;
  (__return_storage_ptr__->table).column_alignment = 0;
  (__return_storage_ptr__->table).column_written = 0;
  (__return_storage_ptr__->table).row_index = 0;
  (__return_storage_ptr__->table).row_count = 0;
  (__return_storage_ptr__->table).name = (char *)0x0;
  (__return_storage_ptr__->table).name_len = 0;
  (__return_storage_ptr__->table).name_written = 0;
  *(undefined8 *)&(__return_storage_ptr__->table).has_next_table = 0;
  return __return_storage_ptr__;
}

Assistant:

ecs_reader_t ecs_reader_init(
    ecs_world_t *world)
{
    ecs_reader_t result = {
        .world = world,
        .state = EcsTableSegment,
        .component_iter = ecs_filter_iter(world, &(ecs_filter_t){
            .include = ecs_type(EcsComponent)
        }),
        .component_next = ecs_filter_next,
        .data_iter = ecs_filter_iter(world, NULL),
        .data_next = ecs_filter_next
    };

    return result;
}